

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermBranch * __thiscall
glslang::TIntermediate::addBranch
          (TIntermediate *this,TOperator branchOp,TIntermTyped *expression,TSourceLoc *loc)

{
  TPoolAllocator *this_00;
  TIntermBranch *this_01;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TIntermBranch *)TPoolAllocator::allocate(this_00,0x30);
  (this_01->super_TIntermNode).loc.name = (TString *)0x0;
  (this_01->super_TIntermNode).loc.string = 0;
  (this_01->super_TIntermNode).loc.line = 0;
  (this_01->super_TIntermNode).loc.column = 0;
  (this_01->super_TIntermNode)._vptr_TIntermNode = (_func_int **)&PTR_getLoc_009415a8;
  this_01->flowOp = branchOp;
  this_01->expression = expression;
  TIntermNode::setLoc((TIntermNode *)this_01,loc);
  return this_01;
}

Assistant:

TIntermBranch* TIntermediate::addBranch(TOperator branchOp, TIntermTyped* expression, const TSourceLoc& loc)
{
    TIntermBranch* node = new TIntermBranch(branchOp, expression);
    node->setLoc(loc);

    return node;
}